

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Constraints.cc
# Opt level: O3

uint __thiscall
RigidBodyDynamics::ConstraintSet::AddCustomConstraint
          (ConstraintSet *this,shared_ptr<RigidBodyDynamics::Constraint> *customConstraint)

{
  ostream *poVar1;
  long lVar2;
  long lVar3;
  char *__s;
  void *pvVar4;
  iterator __position;
  long lVar5;
  size_type sVar6;
  uint uVar7;
  element_type *peVar8;
  RBDLError *pRVar9;
  int iVar10;
  Index new_rows;
  ulong uVar11;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_bool>
  pVar12;
  pair<std::_Rb_tree_iterator<std::pair<const_unsigned_int,_unsigned_int>_>,_bool> pVar13;
  string nameStr;
  stringstream errormsg;
  allocator_type local_28d;
  uint local_28c;
  shared_ptr<RigidBodyDynamics::Constraint> *local_288;
  value_type local_280;
  ConstraintSet *local_260;
  DenseStorage<double,__1,__1,_1,_0> *local_258;
  DenseStorage<double,__1,__1,_1,_0> *local_250;
  DenseStorage<double,__1,__1,_1,_0> *local_248;
  ulong local_240;
  string local_238;
  string local_218;
  string local_1f8;
  undefined1 local_1d8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1c8;
  uint local_1b8;
  value_type local_48;
  
  lVar2 = *(long *)(this + 0xd0);
  uVar11 = (ulong)(*(long *)(this + 0x10) - *(long *)(this + 8)) >> 2;
  iVar10 = (int)uVar11;
  local_28c = ((customConstraint->
               super___shared_ptr<RigidBodyDynamics::Constraint,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
              )->sizeOfConstraint + iVar10;
  lVar3 = *(long *)(this + 200);
  std::
  vector<std::shared_ptr<RigidBodyDynamics::Constraint>,std::allocator<std::shared_ptr<RigidBodyDynamics::Constraint>>>
  ::emplace_back<std::shared_ptr<RigidBodyDynamics::Constraint>&>
            ((vector<std::shared_ptr<RigidBodyDynamics::Constraint>,std::allocator<std::shared_ptr<RigidBodyDynamics::Constraint>>>
              *)(this + 200),customConstraint);
  *(int *)(*(long *)(*(long *)(this + 200) + (lVar2 - lVar3 & 0xffffffff0U)) + 0x34) = iVar10;
  local_280._M_dataplus._M_p = (pointer)&local_280.field_2;
  local_240 = uVar11;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_280);
  sVar6 = local_280._M_string_length;
  __s = (((customConstraint->
          super___shared_ptr<RigidBodyDynamics::Constraint,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
        name)._M_dataplus._M_p;
  local_288 = customConstraint;
  if (__s != (char *)0x0) {
    strlen(__s);
    std::__cxx11::string::_M_replace((ulong)&local_280,0,(char *)sVar6,(ulong)__s);
  }
  local_248 = (DenseStorage<double,__1,__1,_1,_0> *)(this + 0x110);
  uVar11 = (ulong)local_28c;
  Eigen::DenseStorage<double,_-1,_-1,_1,_0>::conservativeResize(local_248,uVar11,uVar11,1);
  local_250 = (DenseStorage<double,__1,__1,_1,_0> *)(this + 0x120);
  Eigen::DenseStorage<double,_-1,_-1,_1,_0>::conservativeResize(local_250,uVar11,uVar11,1);
  local_258 = (DenseStorage<double,__1,__1,_1,_0> *)(this + 0x130);
  Eigen::DenseStorage<double,_-1,_-1,_1,_0>::conservativeResize(local_258,uVar11,uVar11,1);
  Eigen::DenseStorage<double,_-1,_-1,_1,_0>::conservativeResize
            ((DenseStorage<double,__1,__1,_1,_0> *)(this + 0x140),uVar11,uVar11,1);
  Eigen::DenseStorage<double,_-1,_-1,_1,_0>::conservativeResize
            ((DenseStorage<double,__1,__1,_1,_0> *)(this + 0x150),uVar11,uVar11,1);
  local_48.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
  m_data.array[0] = 0.0;
  local_48.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
  m_data.array[1] = 0.0;
  local_48.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
  m_data.array[2] = 0.0;
  std::vector<Vector3_t,_std::allocator<Vector3_t>_>::vector
            ((vector<Vector3_t,_std::allocator<Vector3_t>_> *)local_1d8,uVar11,&local_48,&local_28d)
  ;
  pvVar4 = *(void **)(this + 0x600);
  lVar2 = *(long *)(this + 0x610);
  *(undefined4 *)(this + 0x600) = local_1d8._0_4_;
  *(undefined4 *)(this + 0x604) = local_1d8._4_4_;
  *(undefined8 *)(this + 0x608) = local_1d8._8_8_;
  *(size_type *)(this + 0x610) = local_1c8._M_allocated_capacity;
  local_1d8._0_4_ = 0;
  local_1d8._4_4_ = 0;
  local_1d8._8_8_ = (pointer)0x0;
  local_1c8._M_allocated_capacity = 0;
  if (pvVar4 != (void *)0x0) {
    operator_delete(pvVar4,lVar2 - (long)pvVar4);
    if ((pair<unsigned_int,_unsigned_int>)local_1d8._0_8_ != (pair<unsigned_int,_unsigned_int>)0x0)
    {
      operator_delete((void *)local_1d8._0_8_,local_1c8._M_allocated_capacity - local_1d8._0_8_);
    }
  }
  peVar8 = (local_288->super___shared_ptr<RigidBodyDynamics::Constraint,_(__gnu_cxx::_Lock_policy)2>
           )._M_ptr;
  if (peVar8->sizeOfConstraint != 0) {
    local_260 = this + 8;
    uVar11 = 0;
    do {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)(this + 0x20),&local_280);
      local_1d8._0_4_ = 2;
      __position._M_current = *(ConstraintType **)(this + 0x10);
      if (__position._M_current == *(ConstraintType **)(this + 0x18)) {
        std::
        vector<RigidBodyDynamics::ConstraintType,_std::allocator<RigidBodyDynamics::ConstraintType>_>
        ::_M_realloc_insert<RigidBodyDynamics::ConstraintType>
                  ((vector<RigidBodyDynamics::ConstraintType,_std::allocator<RigidBodyDynamics::ConstraintType>_>
                    *)local_260,__position,(ConstraintType *)local_1d8);
      }
      else {
        *__position._M_current = ConstraintTypeCustom;
        *(ConstraintType **)(this + 0x10) = __position._M_current + 1;
      }
      uVar7 = (int)local_240 + (int)uVar11;
      local_248->m_data[uVar7] = 0.0;
      local_250->m_data[uVar7] = 0.0;
      local_258->m_data[uVar7] = 0.0;
      ((DenseStorage<double,__1,__1,_1,_0> *)(this + 0x140))->m_data[uVar7] = 0.0;
      ((DenseStorage<double,__1,__1,_1,_0> *)(this + 0x150))->m_data[uVar7] = 0.0;
      uVar11 = uVar11 + 1;
      peVar8 = (local_288->
               super___shared_ptr<RigidBodyDynamics::Constraint,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
      ;
    } while (uVar11 < peVar8->sizeOfConstraint);
  }
  if ((char *)local_280._M_string_length != (char *)0x0) {
    lVar2 = *(long *)(this + 0xd0);
    lVar3 = *(long *)(this + 200);
    lVar5 = *(long *)(*(long *)(this + 0x28) + -0x20);
    local_1d8._0_8_ = (long)local_1d8 + 0x10;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_1d8,lVar5,*(long *)(*(long *)(this + 0x28) + -0x18) + lVar5);
    local_1b8 = (int)((ulong)(lVar2 - lVar3) >> 4) - 1;
    pVar12 = std::
             _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_int>,std::_Select1st<std::pair<std::__cxx11::string_const,unsigned_int>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_int>>>
             ::_M_emplace_unique<std::pair<std::__cxx11::string,unsigned_int>>
                       ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_int>,std::_Select1st<std::pair<std::__cxx11::string_const,unsigned_int>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_int>>>
                         *)(this + 0x38),
                        (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
                         *)local_1d8);
    if (local_1d8._0_8_ != (long)local_1d8 + 0x10) {
      operator_delete((void *)local_1d8._0_8_,(ulong)(local_1c8._M_allocated_capacity + 1));
    }
    if (pVar12.second == false) {
      pRVar9 = (RBDLError *)__cxa_allocate_exception(0x28);
      local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_218,"Error: optional name is not unique.\n","");
      Errors::RBDLError::RBDLError(pRVar9,&local_218);
      __cxa_throw(pRVar9,&Errors::RBDLError::typeinfo,Errors::RBDLError::~RBDLError);
    }
    peVar8 = (local_288->
             super___shared_ptr<RigidBodyDynamics::Constraint,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  }
  if (peVar8->id != 0xffffffff) {
    local_1d8._4_4_ = (int)((ulong)(*(long *)(this + 0xd0) - *(long *)(this + 200)) >> 4) - 1;
    local_1d8._0_4_ = peVar8->id;
    pVar13 = std::
             _Rb_tree<unsigned_int,std::pair<unsigned_int_const,unsigned_int>,std::_Select1st<std::pair<unsigned_int_const,unsigned_int>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>>
             ::_M_emplace_unique<std::pair<unsigned_int,unsigned_int>>
                       ((_Rb_tree<unsigned_int,std::pair<unsigned_int_const,unsigned_int>,std::_Select1st<std::pair<unsigned_int_const,unsigned_int>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>>
                         *)(this + 0x68),(pair<unsigned_int,_unsigned_int> *)local_1d8);
    if (pVar13.second == false) {
      pRVar9 = (RBDLError *)__cxa_allocate_exception(0x28);
      local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_238,"Error: optional userDefinedId is not unique.\n","");
      Errors::RBDLError::RBDLError(pRVar9,&local_238);
      __cxa_throw(pRVar9,&Errors::RBDLError::typeinfo,Errors::RBDLError::~RBDLError);
    }
  }
  uVar7 = local_28c - 1;
  local_1d8._4_4_ = (int)((ulong)(*(long *)(this + 0xd0) - *(long *)(this + 200)) >> 4) - 1;
  local_1d8._0_4_ = uVar7;
  pVar13 = std::
           _Rb_tree<unsigned_int,std::pair<unsigned_int_const,unsigned_int>,std::_Select1st<std::pair<unsigned_int_const,unsigned_int>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>>
           ::_M_emplace_unique<std::pair<unsigned_int,unsigned_int>>
                     ((_Rb_tree<unsigned_int,std::pair<unsigned_int_const,unsigned_int>,std::_Select1st<std::pair<unsigned_int_const,unsigned_int>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>>
                       *)(this + 0x98),(pair<unsigned_int,_unsigned_int> *)local_1d8);
  if (pVar13.second != false) {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_280._M_dataplus._M_p != &local_280.field_2) {
      operator_delete(local_280._M_dataplus._M_p,local_280.field_2._M_allocated_capacity + 1);
    }
    return uVar7;
  }
  std::__cxx11::stringstream::stringstream((stringstream *)local_1d8);
  poVar1 = (ostream *)(local_1d8 + 0x10);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,"Error: Constraint row entry into system is not unique.",0x36);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1," (This should not be possible: contact the maintainer of this code.)",0x44);
  std::endl<char,std::char_traits<char>>(poVar1);
  pRVar9 = (RBDLError *)__cxa_allocate_exception(0x28);
  std::__cxx11::stringbuf::str();
  Errors::RBDLError::RBDLError(pRVar9,&local_1f8);
  __cxa_throw(pRVar9,&Errors::RBDLError::typeinfo,Errors::RBDLError::~RBDLError);
}

Assistant:

unsigned int ConstraintSet::AddCustomConstraint(
  std::shared_ptr<Constraint> customConstraint)
{
  unsigned int insertAtRowInG = unsigned(size());
  unsigned int rowsInG = insertAtRowInG+customConstraint->getConstraintSize();
  unsigned int cIndex = constraints.size();

  constraints.emplace_back(customConstraint);
  constraints[cIndex]->addToConstraintSet(insertAtRowInG);

  //Resize constraint set system variables
  std::string nameStr("");
  if(customConstraint->getName() != NULL) {
    nameStr = customConstraint->getName();
  }

  err.conservativeResize(     rowsInG);
  errd.conservativeResize(    rowsInG);
  force.conservativeResize (  rowsInG);
  impulse.conservativeResize (rowsInG);
  v_plus.conservativeResize ( rowsInG);
  d_multdof3_u = std::vector<Math::Vector3d>(rowsInG, Math::Vector3d::Zero());

  for(unsigned int i=0; i<customConstraint->getConstraintSize(); ++i) {
    //The list of names, constraint types, and ids must have the same
    //number of entries as G has rows.
    name.push_back (nameStr);
    constraintType.push_back (ConstraintTypeCustom);


    err[      insertAtRowInG+i ] = 0.;
    errd[     insertAtRowInG+i ] = 0.;
    force[    insertAtRowInG+i ] = 0.;
    impulse[  insertAtRowInG+i ] = 0.;
    v_plus[   insertAtRowInG+i ] = 0.;
  }

  //Set up access maps
  if(nameStr.size() > 0) {
    std::pair< std::map<std::string, unsigned int>::iterator, bool > iter;
    iter = nameGroupMap.insert(std::pair<std::string, unsigned int>(
                                 name[name.size()-1],
                                 unsigned(constraints.size()-1)));
    if(iter.second == false) {
      throw Errors::RBDLError("Error: optional name is not unique.\n");
    }

  }
  if(customConstraint->getUserDefinedId()
      < std::numeric_limits<unsigned int>::max()) {
    std::pair< std::map<unsigned int, unsigned int>::iterator, bool > iter;
    iter =userDefinedIdGroupMap.insert( std::pair<unsigned int, unsigned int>(
                                          customConstraint->getUserDefinedId(),
                                          unsigned(constraints.size()-1)));
    if(iter.second == false) {
      throw Errors::RBDLError("Error: optional userDefinedId is not unique.\n");
    }

  }

  std::pair< std::map<unsigned int, unsigned int>::iterator, bool > iter;
  iter = idGroupMap.insert(std::pair<unsigned int, unsigned int>(
                             unsigned(rowsInG-1),
                             unsigned(constraints.size()-1)));
  if(iter.second == false) {
    std::stringstream errormsg;
    errormsg << "Error: Constraint row entry into system is not unique."
             << " (This should not be possible: contact the "
             "maintainer of this code.)"
             << std::endl;
    throw Errors::RBDLError(errormsg.str());
  }

  return rowsInG-1;

}